

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

uint32 __thiscall Clasp::Solver::inDegree(Solver *this,WeightLitVec *out)

{
  uint uVar1;
  Literal p;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  LitVec temp;
  Antecedent xAnte;
  uint32 local_5c;
  LitVec local_58;
  pair<Clasp::Literal,_int> local_48;
  WeightLitVec *local_40;
  Antecedent local_38;
  
  if ((this->levels_).super_type.ebo_.size == 0) {
    local_5c = 1;
  }
  else {
    local_40 = out;
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    reserve(out,((this->assign_).trail.ebo_.size -
                (*(uint *)(this->levels_).super_type.ebo_.buf & 0x3fffffff)) / 10);
    uVar1 = (this->assign_).trail.ebo_.size;
    uVar5 = (ulong)uVar1;
    uVar6 = *(uint *)(this->levels_).super_type.ebo_.buf & 0x3fffffff;
    local_58.ebo_.buf = (pointer)0x0;
    local_58.ebo_.size = 0;
    local_58.ebo_.cap = 0;
    local_5c = 1;
    if (uVar1 != uVar6) {
      local_5c = 1;
      do {
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
        p.rep_ = (this->assign_).trail.ebo_.buf[uVar5].rep_;
        uVar1 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
        local_38.data_ = (this->assign_).reason_.super_type.ebo_.buf[p.rep_ >> 2].data_;
        if (((uint)local_38.data_ & 3) != 2 && local_38.data_ != 0) {
          Antecedent::reason(&local_38,this,p,&local_58);
          if ((local_58.ebo_._8_8_ & 0xffffffff) != 0) {
            lVar3 = 0;
            uVar2 = 0;
            do {
              uVar2 = (uVar2 + 1) -
                      (uint)((*(uint *)((long)(this->assign_).assign_.ebo_.buf +
                                       (ulong)(*(uint *)((long)&(local_58.ebo_.buf)->rep_ + lVar3) &
                                              0xfffffffc)) ^ uVar1) < 0x10);
              lVar3 = lVar3 + 4;
            } while ((local_58.ebo_._8_8_ & 0xffffffff) << 2 != lVar3);
            if ((uVar2 != 0) &&
               (local_48.first.rep_ = p.rep_, local_48.second = uVar2,
               bk_lib::
               pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
               ::push_back(local_40,&local_48), local_5c < uVar2)) {
              local_5c = uVar2;
            }
          }
          local_58.ebo_._8_8_ = local_58.ebo_._8_8_ & 0xffffffff00000000;
        }
      } while (uVar4 != uVar6);
      if (local_58.ebo_.buf != (pointer)0x0) {
        operator_delete(local_58.ebo_.buf);
      }
    }
  }
  return local_5c;
}

Assistant:

uint32 Solver::inDegree(WeightLitVec& out) {
	if (decisionLevel() == 0) { return 1; }
	assert(!hasConflict());
	out.reserve((numAssignedVars()-levelStart(1))/10);
	uint32 maxIn = 1;
	uint32 i = sizeVec(assign_.trail), stop = levelStart(1);
	for (LitVec temp; i-- != stop; ) {
		Literal x    = assign_.trail[i];
		uint32  xLev = assign_.level(x.var());
		uint32  xIn  = 0;
		Antecedent xAnte = assign_.reason(x.var());
		if (!xAnte.isNull() && xAnte.type() != Antecedent::Binary) {
			xAnte.reason(*this, x, temp);
			for (LitVec::const_iterator it = temp.begin(); it != temp.end(); ++it) {
				xIn += level(it->var()) != xLev;
			}
			if (xIn) {
				out.push_back(WeightLiteral(x, xIn));
				maxIn = std::max(xIn, maxIn);
			}
			temp.clear();
		}
	}
	return maxIn;
}